

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

int readIdentifier(char firstChar)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint16_t uVar5;
  ulong uVar6;
  
  cVar2 = firstChar + -0x20;
  if (firstChar < 'a') {
    cVar2 = firstChar;
  }
  uVar5 = keywordDict[0].children[(byte)(cVar2 - 0x20)];
  uVar4 = firstChar == '.' | 0x4a;
  uVar6 = 1;
  yylval.symName[0] = firstChar;
  while( true ) {
    uVar3 = peek();
    if ((((0x19 < (uVar3 & 0xffffffdf) - 0x41) && (uVar3 != 0x2e)) && (uVar3 != 0x5f)) &&
       (((9 < uVar3 - 0x30 && (uVar3 != 0x23)) && (uVar3 != 0x40)))) break;
    shiftChar();
    if (uVar6 < 0xff) {
      yylval.symName[uVar6] = (char)uVar3;
      if (uVar3 == 0x2e) {
        uVar4 = 0x4b;
      }
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar1 = uVar3 - 0x20;
        if ((char)uVar3 < 'a') {
          uVar1 = uVar3;
        }
        uVar5 = keywordDict[0].children
                [(ulong)uVar5 * 4 + (ulong)uVar5 * 0x40 + (ulong)(byte)((char)uVar1 - 0x20)];
      }
    }
    uVar6 = uVar6 + 1;
  }
  if (0xff < uVar6) {
    warning(WARNING_LONG_STR,"Symbol name too long, got truncated\n");
    uVar6 = 0xff;
  }
  yylval.symName[uVar6] = '\0';
  if (*(long *)(keywordDict[0].children + (ulong)uVar5 * 4 + (ulong)uVar5 * 0x40 + 0x40) != 0) {
    uVar4 = *(uint *)(*(long *)(keywordDict[0].children +
                               (ulong)uVar5 * 4 + (ulong)uVar5 * 0x40 + 0x40) + 8);
  }
  return uVar4;
}

Assistant:

static int readIdentifier(char firstChar)
{
	// Lex while checking for a keyword
	yylval.symName[0] = firstChar;
	uint16_t nodeID = keywordDict[0].children[dictIndex(firstChar)];
	int tokenType = firstChar == '.' ? T_LOCAL_ID : T_ID;
	size_t i = 1;

	// Continue reading while the char is in the symbol charset
	for (int c = peek(); continuesIdentifier(c); i++, c = peek()) {
		shiftChar();

		if (i < sizeof(yylval.symName) - 1) {
			// Write the char to the identifier's name
			yylval.symName[i] = c;

			// If the char was a dot, mark the identifier as local
			if (c == '.')
				tokenType = T_LOCAL_ID;

			// Attempt to traverse the tree to check for a keyword
			if (nodeID) // Do nothing if matching already failed
				nodeID = keywordDict[nodeID].children[dictIndex(c)];
		}
	}

	if (i > sizeof(yylval.symName) - 1) {
		warning(WARNING_LONG_STR, "Symbol name too long, got truncated\n");
		i = sizeof(yylval.symName) - 1;
	}
	yylval.symName[i] = '\0'; // Terminate the string

	if (keywordDict[nodeID].keyword)
		return keywordDict[nodeID].keyword->token;

	return tokenType;
}